

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::checkBonds(MoleculeStamp *this)

{
  int iVar1;
  int iVar2;
  pointer ppBVar3;
  long lVar4;
  pointer piVar5;
  pointer pcVar6;
  int __tmp;
  pointer ppBVar7;
  iterator iVar8;
  ostream *poVar9;
  OpenMDException *pOVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  pair<int,_int> bondPair;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  allBonds;
  ostringstream oss;
  string local_200;
  key_type local_1e0;
  undefined1 local_1d8 [32];
  _Base_ptr local_1b8;
  size_t local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppBVar7 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppBVar3 = (this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar11 = (long)ppBVar3 - (long)ppBVar7 >> 3;
  if (ppBVar3 == ppBVar7) {
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._8_4_ = _S_red;
    local_1d8._16_8_ = (_Base_ptr)0x0;
    local_1b0 = 0;
    local_1b8 = (_Base_ptr)local_1d8._24_8_;
  }
  else {
    lVar14 = uVar11 + (uVar11 == 0);
    lVar15 = 0;
    do {
      lVar4 = *(long *)((long)ppBVar7 + (lVar15 >> 0x1d));
      iVar1 = *(int *)(lVar4 + 0xa0);
      iVar13 = (int)((ulong)((long)(this->atomStamps_).
                                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->atomStamps_).
                                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((((iVar13 <= iVar1) || (iVar1 < 0)) || (iVar2 = *(int *)(lVar4 + 0xa4), iVar1 == iVar2))
         || ((iVar13 <= iVar2 || (iVar2 < 0)))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar6 = (this->Name).data_._M_dataplus._M_p;
        local_1d8._0_8_ = local_1d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar6,pcVar6 + (this->Name).data_._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1d8._0_8_,
                            CONCAT44(local_1d8._12_4_,local_1d8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": bond(",7);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(lVar4 + 0xa0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(lVar4 + 0xa4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") is invalid\n",0xd);
        if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar10,(string *)local_1d8);
        __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar15 = lVar15 + 0x100000000;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
    local_1d8._24_8_ = local_1d8 + 8;
    local_1d8._8_4_ = _S_red;
    local_1d8._16_8_ = (_Base_ptr)0x0;
    local_1b0 = 0;
    local_1b8 = (_Base_ptr)local_1d8._24_8_;
    if (ppBVar3 != ppBVar7) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        lVar15 = *(long *)((long)ppBVar7 + (lVar14 >> 0x1d));
        iVar1 = *(int *)(lVar15 + 0xa0);
        local_1e0.second = *(int *)(lVar15 + 0xa4);
        local_1e0.first = iVar1;
        if (local_1e0.second < iVar1) {
          local_1e0.first = local_1e0.second;
          local_1e0.second = iVar1;
        }
        iVar8 = std::
                _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        *)local_1d8,&local_1e0);
        if (iVar8._M_node != (_Base_ptr)(local_1d8 + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar6 = (this->Name).data_._M_dataplus._M_p;
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,pcVar6,pcVar6 + (this->Name).data_._M_string_length);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                              local_200._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"bond(",5);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8._M_node[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)&iVar8._M_node[1].field_0x4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,") appears multiple times\n",0x19);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar10,&local_200);
          __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>const&>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)local_1d8,&local_1e0);
        uVar12 = uVar12 + 1;
        ppBVar7 = (this->bondStamps_).
                  super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar11 = (long)(this->bondStamps_).
                       super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar7 >> 3;
        lVar14 = lVar14 + 0x100000000;
      } while (uVar12 < uVar11);
    }
  }
  if (uVar11 != 0) {
    piVar5 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = 0;
    do {
      lVar15 = *(long *)((long)ppBVar7 + (lVar14 >> 0x1d));
      if (piVar5[*(int *)(lVar15 + 0xa0)] == piVar5[*(int *)(lVar15 + 0xa4)]) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar6 = (this->Name).data_._M_dataplus._M_p;
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,pcVar6,pcVar6 + (this->Name).data_._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_200._M_dataplus._M_p,
                            local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"bond(",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(lVar15 + 0xa0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(lVar15 + 0xa4));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,") belong to same rigidbody ",0x1b);
        poVar9 = (ostream *)
                 std::ostream::operator<<
                           (poVar9,(this->atom2Rigidbody).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[*(int *)(lVar15 + 0xa0)]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        pOVar10 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar10,&local_200);
        __cxa_throw(pOVar10,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar14 = lVar14 + 0x100000000;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkBonds() {
    std::ostringstream oss;
    // make sure index is not out of range
    int natoms = static_cast<int>(getNAtoms());
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      if (bondStamp->getA() > natoms - 1 || bondStamp->getA() < 0 ||
          bondStamp->getB() > natoms - 1 || bondStamp->getB() < 0 ||
          bondStamp->getA() == bondStamp->getB()) {
        oss << "Error in Molecule " << getName() << ": bond("
            << bondStamp->getA() << ", " << bondStamp->getB()
            << ") is invalid\n";
        throw OpenMDException(oss.str());
      }
    }

    // make sure bonds are unique
    std::set<std::pair<int, int>> allBonds;
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      std::pair<int, int> bondPair(bondStamp->getA(), bondStamp->getB());
      // make sure bondPair.first is always less than or equal to
      // bondPair.third
      if (bondPair.first > bondPair.second) {
        std::swap(bondPair.first, bondPair.second);
      }

      std::set<std::pair<int, int>>::iterator iter = allBonds.find(bondPair);
      if (iter != allBonds.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "bond(" << iter->first << ", " << iter->second
            << ") appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBonds.insert(bondPair);
      }
    }

    // make sure atoms belong to same rigidbody do not bond to each other
    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      if (atom2Rigidbody[bondStamp->getA()] ==
          atom2Rigidbody[bondStamp->getB()]) {
        oss << "Error in Molecule " << getName() << ": "
            << "bond(" << bondStamp->getA() << ", " << bondStamp->getB()
            << ") belong to same rigidbody "
            << atom2Rigidbody[bondStamp->getA()] << "\n";
        throw OpenMDException(oss.str());
      }
    }
  }